

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O2

bool __thiscall
sptk::StatisticsAccumulation::GetStandardDeviation
          (StatisticsAccumulation *this,Buffer *buffer,
          vector<double,_std::allocator<double>_> *standard_deviation)

{
  double *pdVar1;
  bool bVar2;
  double *pdVar3;
  double dVar4;
  
  if (this->is_valid_ == true) {
    bVar2 = false;
    if ((standard_deviation != (vector<double,_std::allocator<double>_> *)0x0) &&
       (bVar2 = false, 1 < this->num_statistics_order_)) {
      bVar2 = GetDiagonalCovariance(this,buffer,standard_deviation);
      if (bVar2) {
        pdVar1 = (standard_deviation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar3 = (standard_deviation->super__Vector_base<double,_std::allocator<double>_>).
                      _M_impl.super__Vector_impl_data._M_start; pdVar3 != pdVar1;
            pdVar3 = pdVar3 + 1) {
          dVar4 = *pdVar3;
          if (dVar4 < 0.0) {
            dVar4 = sqrt(dVar4);
          }
          else {
            dVar4 = SQRT(dVar4);
          }
          *pdVar3 = dVar4;
        }
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool StatisticsAccumulation::GetStandardDeviation(
    const StatisticsAccumulation::Buffer& buffer,
    std::vector<double>* standard_deviation) const {
  if (!is_valid_ || num_statistics_order_ < 2 || NULL == standard_deviation) {
    return false;
  }

  if (!GetDiagonalCovariance(buffer, standard_deviation)) {
    return false;
  }

  std::transform(standard_deviation->begin(), standard_deviation->end(),
                 standard_deviation->begin(),
                 [](double x) { return std::sqrt(x); });

  return true;
}